

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O2

uint8 * __thiscall
caffe::NetParameter::InternalSerializeWithCachedSizesToArray
          (NetParameter *this,bool deterministic,uint8 *target)

{
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  uint uVar1;
  string *psVar2;
  char *data;
  Type *value;
  Type *pTVar3;
  uint8 *puVar4;
  Type *value_00;
  Type *value_01;
  UnknownFieldSet *unknown_fields;
  int iVar5;
  int iVar6;
  
  uVar1 = (this->_has_bits_).has_bits_[0];
  if ((uVar1 & 1) != 0) {
    psVar2 = (this->name_).ptr_;
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              ((psVar2->_M_dataplus)._M_p,(int)psVar2->_M_string_length,SERIALIZE,
               "caffe.NetParameter.name");
    target = google::protobuf::internal::WireFormatLite::WriteStringToArray
                       (1,(this->name_).ptr_,target);
  }
  iVar6 = (this->layers_).super_RepeatedPtrFieldBase.current_size_;
  for (iVar5 = 0; iVar6 != iVar5; iVar5 = iVar5 + 1) {
    value = google::protobuf::internal::RepeatedPtrFieldBase::
            Get<google::protobuf::RepeatedPtrField<caffe::V1LayerParameter>::TypeHandler>
                      (&(this->layers_).super_RepeatedPtrFieldBase,iVar5);
    target = google::protobuf::internal::WireFormatLite::
             InternalWriteMessageNoVirtualToArray<caffe::V1LayerParameter>
                       (2,value,deterministic,target);
  }
  iVar6 = (this->input_).super_RepeatedPtrFieldBase.current_size_;
  iVar5 = 0;
  if (iVar6 < 1) {
    iVar6 = 0;
  }
  this_00 = &this->input_;
  for (; iVar6 != iVar5; iVar5 = iVar5 + 1) {
    pTVar3 = google::protobuf::internal::RepeatedPtrFieldBase::
             Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                       (&this_00->super_RepeatedPtrFieldBase,iVar5);
    data = (pTVar3->_M_dataplus)._M_p;
    pTVar3 = google::protobuf::internal::RepeatedPtrFieldBase::
             Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                       (&this_00->super_RepeatedPtrFieldBase,iVar5);
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              (data,(int)pTVar3->_M_string_length,SERIALIZE,"caffe.NetParameter.input");
    pTVar3 = google::protobuf::internal::RepeatedPtrFieldBase::
             Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                       (&this_00->super_RepeatedPtrFieldBase,iVar5);
    target = google::protobuf::internal::WireFormatLite::WriteStringToArray(3,pTVar3,target);
  }
  puVar4 = google::protobuf::internal::WireFormatLite::WriteInt32ToArray(4,&this->input_dim_,target)
  ;
  if ((uVar1 & 4) != 0) {
    puVar4 = google::protobuf::internal::WireFormatLite::WriteBoolToArray
                       (5,this->force_backward_,puVar4);
  }
  if ((uVar1 & 2) != 0) {
    puVar4 = google::protobuf::internal::WireFormatLite::
             InternalWriteMessageNoVirtualToArray<caffe::NetState>
                       (6,this->state_,deterministic,puVar4);
  }
  if ((uVar1 & 8) != 0) {
    puVar4 = google::protobuf::internal::WireFormatLite::WriteBoolToArray
                       (7,this->debug_info_,puVar4);
  }
  iVar6 = (this->input_shape_).super_RepeatedPtrFieldBase.current_size_;
  for (iVar5 = 0; iVar6 != iVar5; iVar5 = iVar5 + 1) {
    value_00 = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<caffe::BlobShape>::TypeHandler>
                         (&(this->input_shape_).super_RepeatedPtrFieldBase,iVar5);
    puVar4 = google::protobuf::internal::WireFormatLite::
             InternalWriteMessageNoVirtualToArray<caffe::BlobShape>(8,value_00,deterministic,puVar4)
    ;
  }
  iVar6 = (this->layer_).super_RepeatedPtrFieldBase.current_size_;
  for (iVar5 = 0; iVar6 != iVar5; iVar5 = iVar5 + 1) {
    value_01 = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<caffe::LayerParameter>::TypeHandler>
                         (&(this->layer_).super_RepeatedPtrFieldBase,iVar5);
    puVar4 = google::protobuf::internal::WireFormatLite::
             InternalWriteMessageNoVirtualToArray<caffe::LayerParameter>
                       (100,value_01,deterministic,puVar4);
  }
  if (((ulong)(this->_internal_metadata_).
              super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
              .ptr_ & 1) == 0) {
    return puVar4;
  }
  unknown_fields = NetParameter::unknown_fields(this);
  puVar4 = google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray
                     (unknown_fields,puVar4);
  return puVar4;
}

Assistant:

::google::protobuf::uint8* NetParameter::InternalSerializeWithCachedSizesToArray(
    bool deterministic, ::google::protobuf::uint8* target) const {
  // @@protoc_insertion_point(serialize_to_array_start:caffe.NetParameter)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = _has_bits_[0];
  // optional string name = 1;
  if (cached_has_bits & 0x00000001u) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->name().data(), this->name().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "caffe.NetParameter.name");
    target =
      ::google::protobuf::internal::WireFormatLite::WriteStringToArray(
        1, this->name(), target);
  }

  // repeated .caffe.V1LayerParameter layers = 2;
  for (unsigned int i = 0, n = this->layers_size(); i < n; i++) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        2, this->layers(i), deterministic, target);
  }

  // repeated string input = 3;
  for (int i = 0, n = this->input_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->input(i).data(), this->input(i).length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "caffe.NetParameter.input");
    target = ::google::protobuf::internal::WireFormatLite::
      WriteStringToArray(3, this->input(i), target);
  }

  // repeated int32 input_dim = 4;
  target = ::google::protobuf::internal::WireFormatLite::
    WriteInt32ToArray(4, this->input_dim_, target);

  // optional bool force_backward = 5 [default = false];
  if (cached_has_bits & 0x00000004u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteBoolToArray(5, this->force_backward(), target);
  }

  // optional .caffe.NetState state = 6;
  if (cached_has_bits & 0x00000002u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        6, *this->state_, deterministic, target);
  }

  // optional bool debug_info = 7 [default = false];
  if (cached_has_bits & 0x00000008u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteBoolToArray(7, this->debug_info(), target);
  }

  // repeated .caffe.BlobShape input_shape = 8;
  for (unsigned int i = 0, n = this->input_shape_size(); i < n; i++) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        8, this->input_shape(i), deterministic, target);
  }

  // repeated .caffe.LayerParameter layer = 100;
  for (unsigned int i = 0, n = this->layer_size(); i < n; i++) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        100, this->layer(i), deterministic, target);
  }

  if (_internal_metadata_.have_unknown_fields()) {
    target = ::google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray(
        unknown_fields(), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:caffe.NetParameter)
  return target;
}